

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O3

void do_resets(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  RESET_DATA **ppRVar2;
  ROOM_INDEX_DATA *pRVar3;
  AREA_DATA_conflict *pAVar4;
  RESET_DATA *pRVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  RESET_DATA *pRVar10;
  MOB_INDEX_DATA *pMVar11;
  RESET_DATA *pRVar12;
  OBJ_INDEX_DATA *pOVar13;
  short sVar14;
  short sVar15;
  char arg3 [4608];
  char arg4 [4608];
  char arg2 [4608];
  char arg5 [4608];
  char arg1 [4608];
  char arg7 [4608];
  char arg6 [4608];
  char acStack_7e28 [4608];
  char local_6c28 [4608];
  char local_5a28 [4608];
  char local_4828 [4608];
  char local_3628 [4608];
  char local_2428 [4608];
  char local_1228 [4616];
  
  bVar6 = check_security(ch);
  if (!bVar6) {
    return;
  }
  pcVar8 = one_argument(argument,local_3628);
  pcVar8 = one_argument(pcVar8,local_5a28);
  pcVar8 = one_argument(pcVar8,acStack_7e28);
  pcVar8 = one_argument(pcVar8,local_6c28);
  pcVar8 = one_argument(pcVar8,local_4828);
  pcVar8 = one_argument(pcVar8,local_1228);
  one_argument(pcVar8,local_2428);
  bVar6 = is_switched(ch);
  if (bVar6) {
LAB_0035552a:
    pcVar8 = "Resets: Invalid security for editing this area.\n\r";
    goto LAB_00355531;
  }
  pRVar3 = ch->in_room;
  pAVar4 = pRVar3->area;
  if (ch->pcdata->security <= pAVar4->security) {
    pcVar8 = pAVar4->builders;
    pcVar9 = strstr(pcVar8,ch->name);
    if ((pcVar9 == (char *)0x0) && (pcVar8 = strstr(pcVar8,"All"), pcVar8 == (char *)0x0))
    goto LAB_0035552a;
  }
  if (local_3628[0] == '\0') {
    if (pRVar3->reset_first == (RESET_DATA *)0x0) {
      send_to_char("No resets in this room.\n\r",ch);
    }
    else {
      send_to_char("Resets: M = mobile, R = room, O = object, P = pet, S = shopkeeper\n\r",ch);
      display_resets(ch);
    }
  }
  bVar6 = is_number(local_3628);
  if (!bVar6) {
    return;
  }
  pRVar3 = ch->in_room;
  bVar6 = str_cmp(local_5a28,"delete");
  if (bVar6) {
    bVar6 = str_cmp(local_5a28,"door");
    if (bVar6) {
      bVar6 = str_cmp(local_5a28,"follow");
      if (bVar6) {
        bVar6 = str_cmp(local_5a28,"mob");
        if (((bVar6) || (bVar6 = is_number(acStack_7e28), !bVar6)) &&
           ((bVar6 = str_cmp(local_5a28,"obj"), bVar6 || (bVar6 = is_number(acStack_7e28), !bVar6)))
           ) {
          send_to_char("Syntax: RESET <number> OBJ <vnum> <wear_loc>\n\r",ch);
          send_to_char("        RESET <number> OBJ <vnum> inside <vnum> [limit] [count]\n\r",ch);
          send_to_char("        RESET <number> OBJ <vnum> room\n\r",ch);
          send_to_char("        RESET <number> MOB <vnum> [max # area] [max # room]\n\r",ch);
          send_to_char("        RESET <number> DELETE\n\r",ch);
          send_to_char("        RESET <number> DOOR <direction> <closed/locked>\n\r",ch);
          pcVar8 = "        RESET <number> FOLLOW <follower vnum> <leader vnum>\n\r";
          goto LAB_00355531;
        }
        bVar6 = str_cmp(local_5a28,"mob");
        if (bVar6) {
          bVar6 = str_cmp(local_5a28,"obj");
          if (bVar6) {
            pRVar12 = (RESET_DATA *)0x0;
          }
          else {
            pRVar12 = new_reset_data();
            atoi(acStack_7e28);
            pOVar13 = get_obj_index(0);
            if (pOVar13 == (OBJ_INDEX_DATA *)0x0) {
              pcVar8 = "That object does not exist.\n\r";
              goto LAB_00355531;
            }
            iVar7 = atoi(acStack_7e28);
            pRVar12->arg1 = (short)iVar7;
            bVar6 = str_prefix(local_6c28,"inside");
            if (bVar6) {
              bVar6 = str_cmp(local_6c28,"room");
              if (bVar6) {
                iVar7 = flag_value(wear_loc_flags,local_6c28);
                if (iVar7 == -99) {
                  pcVar8 = "Resets: \'? wear-loc\'\n\r";
                  goto LAB_00355531;
                }
                pRVar12 = new_reset_data();
                atoi(acStack_7e28);
                pOVar13 = get_obj_index(0);
                if (pOVar13 != (OBJ_INDEX_DATA *)0x0) {
                  iVar7 = atoi(acStack_7e28);
                  pRVar12->arg1 = (short)iVar7;
                  iVar7 = flag_value(wear_loc_flags,local_6c28);
                  pRVar12->arg3 = (short)iVar7;
                  if ((short)iVar7 == -1) {
                    pRVar12->command = 'G';
                  }
                  else {
                    pRVar12->command = 'E';
                  }
                  goto LAB_00355866;
                }
              }
              else {
                pRVar12 = new_reset_data();
                pRVar12->command = 'O';
                atoi(acStack_7e28);
                pOVar13 = get_obj_index(0);
                if (pOVar13 != (OBJ_INDEX_DATA *)0x0) {
                  iVar7 = atoi(acStack_7e28);
                  pRVar12->arg1 = (short)iVar7;
                  sVar14 = 0;
                  pRVar12->arg2 = 0;
                  pRVar12->arg3 = ch->in_room->vnum;
                  goto LAB_00355ba7;
                }
              }
              pcVar8 = "Vnum does not exist.\n\r";
              goto LAB_00355531;
            }
            pRVar12->command = 'P';
            pRVar12->arg2 = 0;
            bVar6 = is_number(local_4828);
            if (bVar6) {
              atoi(local_4828);
            }
            pOVar13 = get_obj_index(0);
            if (pOVar13->item_type != 0xf) {
              pcVar8 = "Object2 is not a container\n\r";
              goto LAB_00355531;
            }
            bVar6 = is_number(local_1228);
            sVar15 = 1;
            sVar14 = 1;
            if (bVar6) {
              iVar7 = atoi(local_1228);
              sVar14 = (short)iVar7;
            }
            pRVar12->arg2 = sVar14;
            bVar6 = is_number(local_4828);
            if (bVar6) {
              iVar7 = atoi(local_4828);
              sVar15 = (short)iVar7;
            }
            pRVar12->arg3 = sVar15;
            bVar6 = is_number(local_2428);
            sVar14 = 1;
            if (bVar6) {
              iVar7 = atoi(local_2428);
              sVar14 = (short)iVar7;
            }
LAB_00355ba7:
            pRVar12->arg4 = sVar14;
          }
        }
        else {
          pRVar12 = new_reset_data();
          pRVar12->command = 'M';
          bVar6 = is_number(acStack_7e28);
          if (bVar6) {
            atoi(acStack_7e28);
          }
          pMVar11 = get_mob_index(0);
          if (pMVar11 == (MOB_INDEX_DATA *)0x0) {
            pcVar8 = "Mob does not exist.\n\r";
            goto LAB_00355531;
          }
          iVar7 = atoi(acStack_7e28);
          pRVar12->arg1 = (short)iVar7;
          bVar6 = is_number(local_6c28);
          sVar15 = 1;
          sVar14 = 1;
          if (bVar6) {
            iVar7 = atoi(local_6c28);
            sVar14 = (short)iVar7;
          }
          pRVar12->arg2 = sVar14;
          pRVar12->arg3 = ch->in_room->vnum;
          bVar6 = is_number(local_4828);
          if (bVar6) {
            iVar7 = atoi(local_4828);
            sVar15 = (short)iVar7;
          }
          pRVar12->arg4 = sVar15;
        }
      }
      else {
        pRVar12 = new_reset_data();
        pRVar12->command = 'F';
        atoi(acStack_7e28);
        pMVar11 = get_mob_index(0);
        if (pMVar11 == (MOB_INDEX_DATA *)0x0) {
          pcVar8 = "That is not a valid follower vnum.\n\r";
          goto LAB_00355531;
        }
        atoi(local_6c28);
        pMVar11 = get_mob_index(0);
        if (pMVar11 == (MOB_INDEX_DATA *)0x0) {
          pcVar8 = "That is not a valid leader vnum.\n\r";
          goto LAB_00355531;
        }
        iVar7 = atoi(acStack_7e28);
        pRVar12->arg1 = (short)iVar7;
        iVar7 = atoi(local_6c28);
        pRVar12->arg2 = (short)iVar7;
        pRVar12->arg3 = 0;
        pRVar12->arg4 = 0;
      }
    }
    else {
      pRVar12 = new_reset_data();
      pRVar12->command = 'D';
      iVar7 = flag_lookup(acStack_7e28,direction_table);
      if (iVar7 == -99) {
        pcVar8 = "No exit that direction.\n\r";
        goto LAB_00355531;
      }
      pRVar12->arg1 = pRVar3->vnum;
      iVar7 = flag_lookup(acStack_7e28,direction_table);
      pRVar12->arg2 = (short)iVar7;
      bVar6 = str_cmp(local_6c28,"closed");
      sVar14 = 1;
      if (bVar6) {
        bVar6 = str_cmp(local_6c28,"locked");
        sVar14 = 2;
        if (bVar6) {
          pcVar8 = "Not a possible state.\n\r";
          goto LAB_00355531;
        }
      }
      pRVar12->arg3 = sVar14;
      pRVar12->arg4 = 0;
    }
LAB_00355866:
    pRVar3 = ch->in_room;
    iVar7 = atoi(local_3628);
    add_reset(pRVar3,pRVar12,iVar7);
    plVar1 = ch->in_room->area->area_flags;
    *plVar1 = *plVar1 | 8;
    pcVar8 = "Reset added.\n\r";
    goto LAB_00355531;
  }
  iVar7 = atoi(local_3628);
  if (ch->in_room->reset_first == (RESET_DATA *)0x0) {
    pcVar8 = "No resets in this area.\n\r";
    goto LAB_00355531;
  }
  ppRVar2 = &pRVar3->reset_first;
  if (iVar7 < 2) {
    pRVar12 = *ppRVar2;
    pRVar5 = pRVar12->next;
    *ppRVar2 = pRVar5;
    if (pRVar5 == (RESET_DATA *)0x0) {
      pRVar10 = (RESET_DATA *)0x0;
      goto LAB_00355941;
    }
  }
  else {
    pRVar5 = (RESET_DATA *)0x0;
    pRVar12 = (RESET_DATA *)ppRVar2;
    do {
      pRVar10 = pRVar5;
      pRVar12 = pRVar12->next;
      if (pRVar12 == (RESET_DATA *)0x0) {
        pcVar8 = "Reset not found.\n\r";
        goto LAB_00355531;
      }
      iVar7 = iVar7 + -1;
      pRVar5 = pRVar12;
    } while (iVar7 != 0);
    if (pRVar10 == (RESET_DATA *)0x0) {
      pRVar5 = (*ppRVar2)->next;
      *ppRVar2 = pRVar5;
    }
    else {
      pRVar10->next = pRVar10->next->next;
      pRVar5 = *ppRVar2;
    }
    do {
      pRVar10 = pRVar5;
      pRVar5 = pRVar10->next;
    } while (pRVar10->next != (RESET_DATA *)0x0);
LAB_00355941:
    pRVar3->reset_last = pRVar10;
  }
  free_reset_data(pRVar12);
  pcVar8 = "Reset deleted.\n\r";
LAB_00355531:
  send_to_char(pcVar8,ch);
  return;
}

Assistant:

void do_resets(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	char arg4[MAX_INPUT_LENGTH];
	char arg5[MAX_INPUT_LENGTH];
	char arg6[MAX_INPUT_LENGTH];
	char arg7[MAX_INPUT_LENGTH];
	RESET_DATA *pReset = nullptr;

	if (!check_security(ch))
		return;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);
	argument = one_argument(argument, arg4);
	argument = one_argument(argument, arg5);
	argument = one_argument(argument, arg6);
	argument = one_argument(argument, arg7);

	if (!IS_BUILDER(ch, ch->in_room->area))
	{
		send_to_char("Resets: Invalid security for editing this area.\n\r", ch);
		return;
	}

	/*
	 * Display resets in current room.
	 * -------------------------------
	 */
	if (arg1[0] == '\0')
	{
		if (ch->in_room->reset_first)
		{
			send_to_char("Resets: M = mobile, R = room, O = object, "\
						 "P = pet, S = shopkeeper\n\r", ch);
			display_resets(ch);
		}
		else
		{
			send_to_char("No resets in this room.\n\r", ch);
		}
	}

	/*
	 * Take index number and search for commands.
	 * ------------------------------------------
	 */
	if (is_number(arg1))
	{
		ROOM_INDEX_DATA *pRoom = ch->in_room;

		/*
		 * Delete a reset.
		 * ---------------
		 */
		if (!str_cmp(arg2, "delete"))
		{
			int insert_loc = atoi(arg1);

			if (!ch->in_room->reset_first)
			{
				send_to_char("No resets in this area.\n\r", ch);
				return;
			}

			if (insert_loc - 1 <= 0)
			{
				pReset = pRoom->reset_first;
				pRoom->reset_first = pRoom->reset_first->next;

				if (!pRoom->reset_first)
					pRoom->reset_last = nullptr;
			}
			else
			{
				int iReset = 0;
				RESET_DATA *prev = nullptr;

				for (pReset = pRoom->reset_first; pReset; pReset = pReset->next)
				{
					if (++iReset == insert_loc)
						break;
					prev = pReset;
				}

				if (!pReset)
				{
					send_to_char("Reset not found.\n\r", ch);
					return;
				}

				if (prev)
					prev->next = prev->next->next;
				else
					pRoom->reset_first = pRoom->reset_first->next;

				for (pRoom->reset_last = pRoom->reset_first;
					pRoom->reset_last->next;
					pRoom->reset_last = pRoom->reset_last->next);
			}

			free_reset_data(pReset);
			send_to_char("Reset deleted.\n\r", ch);
		}
		else if ((!str_cmp(arg2, "door"))) /* Door reset. */
		{
			pReset = new_reset_data();
			pReset->command = 'D';

			if (flag_lookup(arg3, direction_table) == NO_FLAG)
			{
				send_to_char("No exit that direction.\n\r", ch);
				return;
			}

			pReset->arg1 = pRoom->vnum;
			pReset->arg2 = flag_lookup(arg3, direction_table);

			if (!str_cmp(arg4, "closed"))
			{
				pReset->arg3 = 1;
			}
			else if (!str_cmp(arg4, "locked"))
			{
				pReset->arg3 = 2;
			}
			else
			{
				send_to_char("Not a possible state.\n\r", ch);
				return;
			}

			pReset->arg4 = 0;

			add_reset(ch->in_room, pReset, atoi(arg1));
			SET_BIT(ch->in_room->area->area_flags, AREA_CHANGED);
			send_to_char("Reset added.\n\r", ch);
		}
		else if (!str_cmp(arg2, "follow")) /* Follow resets */
		{
			pReset = new_reset_data();
			pReset->command = 'F';

			if (get_mob_index(atoi(arg3)) == nullptr)
			{
				send_to_char("That is not a valid follower vnum.\n\r", ch);
				return;
			}

			if (get_mob_index(atoi(arg4)) == nullptr)
			{
				send_to_char("That is not a valid leader vnum.\n\r", ch);
				return;
			}

			pReset->arg1 = atoi(arg3);
			pReset->arg2 = atoi(arg4);
			pReset->arg3 = 0;
			pReset->arg4 = 0;

			add_reset(ch->in_room, pReset, atoi(arg1));
			SET_BIT(ch->in_room->area->area_flags, AREA_CHANGED);
			send_to_char("Reset added.\n\r", ch);
		}
		else if ((!str_cmp(arg2, "mob") && is_number(arg3)) || (!str_cmp(arg2, "obj") && is_number(arg3))) /* Add a reset. */
		{
			if (!str_cmp(arg2, "mob")) /* Check for Mobile reset. */
			{
				pReset = new_reset_data();
				pReset->command = 'M';

				if (get_mob_index(is_number(arg3) ? atoi(arg3) : 1) == nullptr)
				{
					send_to_char("Mob does not exist.\n\r", ch);
					return;
				}

				pReset->arg1 = atoi(arg3);
				pReset->arg2 = is_number(arg4) ? atoi(arg4) : 1; /* Max # */
				pReset->arg3 = ch->in_room->vnum;
				pReset->arg4 = is_number(arg5) ? atoi(arg5) : 1; /* Min # */
			}
			else if (!str_cmp(arg2, "obj")) /* Check for Object reset. */
			{
				pReset = new_reset_data();
				if (get_obj_index(atoi(arg3)) == nullptr)
					return send_to_char("That object does not exist.\n\r", ch);
				pReset->arg1 = atoi(arg3);

				if (!str_prefix(arg4, "inside")) /* Inside another object. */
				{
					pReset->command = 'P';
					pReset->arg2 = 0;
					if ((get_obj_index(is_number(arg5) ? atoi(arg5) : 1))->item_type != ITEM_CONTAINER)
					{
						send_to_char("Object2 is not a container\n\r", ch);
						return;
					}
					pReset->arg2 = is_number(arg6) ? atoi(arg6) : 1;
					pReset->arg3 = is_number(arg5) ? atoi(arg5) : 1;
					pReset->arg4 = is_number(arg7) ? atoi(arg7) : 1;
				}
				else if (!str_cmp(arg4, "room")) /* Inside the room. */
				{
					pReset = new_reset_data();
					pReset->command = 'O';

					if (get_obj_index(atoi(arg3)) == nullptr)
					{
						send_to_char("Vnum does not exist.\n\r", ch);
						return;
					}

					pReset->arg1 = atoi(arg3);
					pReset->arg2 = 0;
					pReset->arg3 = ch->in_room->vnum;
					pReset->arg4 = 0;
				}
				else /* Into a Mobile's inventory. */
				{
					if (flag_value(wear_loc_flags, arg4) == NO_FLAG)
					{
						send_to_char("Resets: '? wear-loc'\n\r", ch);
						return;
					}

					pReset = new_reset_data();

					if (get_obj_index(atoi(arg3)) == nullptr)
					{
						send_to_char("Vnum does not exist.\n\r", ch);
						return;
					}

					pReset->arg1 = atoi(arg3);
					pReset->arg3 = flag_value(wear_loc_flags, arg4);

					if (pReset->arg3 == WEAR_NONE)
						pReset->command = 'G';
					else
						pReset->command = 'E';
				}
			}

			add_reset(ch->in_room, pReset, atoi(arg1));
			SET_BIT(ch->in_room->area->area_flags, AREA_CHANGED);
			send_to_char("Reset added.\n\r", ch);
		}
		else
		{
			send_to_char("Syntax: RESET <number> OBJ <vnum> <wear_loc>\n\r", ch);
			send_to_char("        RESET <number> OBJ <vnum> inside <vnum> [limit] [count]\n\r", ch);
			send_to_char("        RESET <number> OBJ <vnum> room\n\r", ch);
			send_to_char("        RESET <number> MOB <vnum> [max # area] [max # room]\n\r", ch);
			send_to_char("        RESET <number> DELETE\n\r", ch);
			send_to_char("        RESET <number> DOOR <direction> <closed/locked>\n\r", ch);
			send_to_char("        RESET <number> FOLLOW <follower vnum> <leader vnum>\n\r", ch);
		}
	}
}